

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfDeque.c
# Opt level: O1

void * sbfDeque_popBack(sbfDeque dq)

{
  int *piVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  void *pvVar5;
  sbfDequeItemImpl ***pppsVar6;
  bool bVar7;
  
  puVar2 = (undefined8 *)(dq->mList).tqh_last[1]->mPointer;
  if (puVar2 == (undefined8 *)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = (void *)*puVar2;
    lVar3 = puVar2[1];
    pppsVar6 = (sbfDequeItemImpl ***)(lVar3 + 0x10);
    if (lVar3 == 0) {
      pppsVar6 = &(dq->mList).tqh_last;
    }
    *pppsVar6 = (sbfDequeItemImpl **)puVar2[2];
    *(long *)puVar2[2] = lVar3;
    lVar3 = puVar2[-2];
    LOCK();
    piVar1 = (int *)(*(long *)(lVar3 + 0x28) + 0x1c);
    *piVar1 = *piVar1 + 1;
    UNLOCK();
    do {
      lVar4 = *(long *)(lVar3 + 0x20);
      puVar2[-1] = lVar4;
      LOCK();
      bVar7 = lVar4 == *(long *)(lVar3 + 0x20);
      if (bVar7) {
        *(long *)(lVar3 + 0x20) = (long)(puVar2 + -2);
      }
      UNLOCK();
    } while (!bVar7);
  }
  return pvVar5;
}

Assistant:

void*
sbfDeque_popBack (sbfDeque dq)
{
    sbfDequeItem dqe;
    void*        vp;

    dqe = TAILQ_LAST (&dq->mList, sbfDequeItemListImpl);
    if (dqe == NULL)
        return NULL;
    vp = dqe->mPointer;

    TAILQ_REMOVE (&dq->mList, dqe, mListEntry);
    sbfPool_put (dqe);

    return vp;
}